

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

void generate_SSA(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes,map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                         *global,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom_f,vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *vars,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Rb_tree_color _Var5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  pointer pVVar10;
  BasicBlock *b;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this;
  pointer pVVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Self __tmp;
  _Base_ptr p_Var17;
  ulong uVar18;
  _Base_ptr p_Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree_header *p_Var20;
  _Rb_tree_color *p_Var21;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar22;
  _Self __tmp_1;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom_tree;
  shared_ptr<mir::inst::PhiInst> irphi_1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> varset;
  shared_ptr<mir::inst::PhiInst> irphi;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  phi;
  _Rb_tree_node_base *local_2b0;
  _Deque_base<int,_std::allocator<int>_> local_298;
  _Base_ptr local_240;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_238;
  _Rb_tree_node_base *local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_210;
  VarId local_1e0;
  undefined8 local_1d0;
  uint32_t *local_1c8;
  uint32_t *local_1c0;
  undefined8 local_1b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_1b0;
  _Rb_tree_node_base *local_1a8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_1a0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_188;
  VarId local_170;
  undefined **local_160;
  uint32_t local_158;
  undefined **local_150;
  undefined4 local_148;
  undefined **local_140;
  undefined4 local_138;
  VarId local_130;
  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_120;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  p_Var2 = &local_120._M_impl.super__Rb_tree_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0 = (global->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a8 = &(global->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_1b0 = &dom->_M_t;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_2b0 != local_1a8) {
    local_240 = &(dom_f->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
    local_238 = dom_f;
    do {
      local_298._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_298,0);
      p_Var11 = local_2b0[2]._M_parent;
      p_Var16 = local_240;
      pmVar22 = local_238;
      while (local_240 = p_Var16, local_238 = pmVar22,
            p_Var11 != (_Rb_tree_node_base *)&local_2b0[1]._M_right) {
        if ((pointer)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (pointer)(local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_298,(int *)(p_Var11 + 1));
        }
        else {
          *(_Rb_tree_color *)
           &(((pointer)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->super_Displayable
            )._vptr_Displayable = p_Var11[1]._M_color;
          local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((long)&(((pointer)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                       super_Displayable)._vptr_Displayable + 4);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        p_Var16 = local_240;
        pmVar22 = local_238;
      }
      if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_298._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_230 = local_2b0 + 1;
        do {
          iVar3 = *(int *)&((Displayable *)local_298._M_impl.super__Deque_impl_data._M_start._M_cur)
                           ->_vptr_Displayable;
          if (local_298._M_impl.super__Deque_impl_data._M_start._M_cur ==
              (_Elt_pointer)
              &((pointer)((long)local_298._M_impl.super__Deque_impl_data._M_start._M_last + -0x10))
               ->field_0xc) {
            operator_delete(local_298._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_298._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_298._M_impl.super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 ((long)local_298._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200);
            local_298._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_298._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_298._M_impl.super__Deque_impl_data._M_start._M_cur =
                 (_Elt_pointer)
                 ((long)&((Displayable *)local_298._M_impl.super__Deque_impl_data._M_start._M_cur)->
                         _vptr_Displayable + 4);
          }
          p_Var13 = (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var17 = p_Var16;
          if (p_Var13 != (_Base_ptr)0x0) {
            do {
              if (iVar3 <= (int)p_Var13[1]._M_color) {
                p_Var17 = p_Var13;
              }
              p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < iVar3];
            } while (p_Var13 != (_Base_ptr)0x0);
            if (((p_Var17 != p_Var16) && ((int)p_Var17[1]._M_color <= iVar3)) &&
               (p_Var13 = p_Var17[1]._M_parent, p_Var17[1]._M_left != p_Var13)) {
              uVar18 = 0;
              do {
                _Var4 = (&p_Var13->_M_color)[uVar18];
                p_Var16 = &p_Var2->_M_header;
                p_Var13 = local_120._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var14 = &p_Var2->_M_header;
                if (local_120._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                  do {
                    p_Var15 = p_Var13;
                    p_Var19 = p_Var16;
                    _Var5 = p_Var15[1]._M_color;
                    p_Var16 = p_Var15;
                    if ((int)_Var5 < (int)_Var4) {
                      p_Var16 = p_Var19;
                    }
                    p_Var13 = (&p_Var15->_M_left)[(int)_Var5 < (int)_Var4];
                  } while ((&p_Var15->_M_left)[(int)_Var5 < (int)_Var4] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var16 != p_Var2) {
                    if ((int)_Var5 < (int)_Var4) {
                      p_Var15 = p_Var19;
                    }
                    p_Var14 = p_Var16;
                    if ((int)_Var4 < (int)p_Var15[1]._M_color) {
                      p_Var14 = &p_Var2->_M_header;
                    }
                  }
                }
                if (-1 < (int)_Var4) {
                  if ((_Rb_tree_header *)p_Var14 == p_Var2) {
                    p_Var16 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var13 = &p_Var1->_M_header;
                    p_Var20 = p_Var1;
                    if (p_Var16 != (_Base_ptr)0x0) {
                      do {
                        if ((int)_Var4 <= (int)*(size_t *)(p_Var16 + 1)) {
                          p_Var13 = p_Var16;
                        }
                        p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < (int)_Var4];
                      } while (p_Var16 != (_Base_ptr)0x0);
                      if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
                         (p_Var20 = (_Rb_tree_header *)p_Var13,
                         (int)_Var4 < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
                        p_Var20 = p_Var1;
                      }
                    }
                    local_140 = &PTR_display_001eb100;
                    local_138 = *(undefined4 *)&local_2b0[1]._M_parent;
                    ir_phi((VarId *)local_228,(int)&local_140);
                    lVar8 = *(long *)(p_Var20 + 1);
                    lVar9 = *(long *)(lVar8 + 8);
                    local_218 = (undefined1  [8])local_228._0_8_;
                    local_210._M_impl._0_8_ = local_228._8_8_;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(_Atomic_word *)(local_228._8_8_ + 8) =
                             *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
                        UNLOCK();
                      }
                      else {
                        *(_Atomic_word *)(local_228._8_8_ + 8) =
                             *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
                      }
                    }
                    local_210._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
                    std::
                    vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                    ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                      *)(lVar8 + 8),
                                     (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                      *)(lVar9 + 0x18),(value_type *)local_218);
                    (*std::__detail::__variant::
                      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                      ::_S_vtable._M_arr
                      [(byte)(undefined1)local_210._M_impl.super__Rb_tree_header._M_header._M_color]
                      ._M_data)((anon_class_1_0_00000001 *)&local_1e0,
                                (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                 *)local_218);
                    local_1e0.id = 0;
                    local_1d0 = 0;
                    local_1c8 = &local_1e0.id;
                    local_1b8 = 0;
                    local_1c0 = local_1c8;
                    std::
                    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                    ::_M_insert_unique<mir::inst::VarId_const&>
                              ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                                *)&local_1e0,(VarId *)local_230);
                    local_218._0_4_ = (&(p_Var17[1]._M_parent)->_M_color)[uVar18];
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::_Rb_tree(&local_210,
                               (_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)&local_1e0);
                    std::
                    _Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
                    ::
                    _M_insert_unique<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
                              ((_Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
                                *)&local_120,
                               (pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                                *)local_218);
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::~_Rb_tree(&local_210);
                    p_Var21 = &(p_Var17[1]._M_parent)->_M_color + uVar18;
                    if ((pointer)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        (pointer)(local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1))
                    {
                      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                ((deque<int,std::allocator<int>> *)&local_298,(int *)p_Var21);
                    }
                    else {
                      *(_Rb_tree_color *)
                       &((Displayable *)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                        _vptr_Displayable = *p_Var21;
                      local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           (_Elt_pointer)
                           ((long)&((Displayable *)
                                   local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                                   _vptr_Displayable + 4);
                    }
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 *)&local_1e0);
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
                  }
                  else {
                    if (p_Var14[1]._M_right != (_Base_ptr)0x0) {
                      uVar6 = *(uint *)&local_2b0[1]._M_parent;
                      p_Var16 = p_Var14[1]._M_right;
                      p_Var13 = (_Base_ptr)&p_Var14[1]._M_left;
                      do {
                        p_Var19 = p_Var13;
                        p_Var15 = p_Var16;
                        uVar7 = *(uint *)&p_Var15[1]._M_parent;
                        p_Var13 = p_Var15;
                        if (uVar7 < uVar6) {
                          p_Var13 = p_Var19;
                        }
                        p_Var16 = (&p_Var15->_M_left)[uVar7 < uVar6];
                      } while ((&p_Var15->_M_left)[uVar7 < uVar6] != (_Base_ptr)0x0);
                      if (p_Var13 != (_Base_ptr)&p_Var14[1]._M_left) {
                        if (uVar7 < uVar6) {
                          p_Var15 = p_Var19;
                        }
                        if (*(uint *)&p_Var15[1]._M_parent <= uVar6) goto LAB_00194fe8;
                      }
                    }
                    p_Var16 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var13 = &p_Var1->_M_header;
                    p_Var20 = p_Var1;
                    if (p_Var16 != (_Base_ptr)0x0) {
                      do {
                        if ((int)_Var4 <= (int)*(size_t *)(p_Var16 + 1)) {
                          p_Var13 = p_Var16;
                        }
                        p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < (int)_Var4];
                      } while (p_Var16 != (_Base_ptr)0x0);
                      if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
                         (p_Var20 = (_Rb_tree_header *)p_Var13,
                         (int)_Var4 < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
                        p_Var20 = p_Var1;
                      }
                    }
                    local_150 = &PTR_display_001eb100;
                    local_148 = *(undefined4 *)&local_2b0[1]._M_parent;
                    ir_phi(&local_1e0,(int)&local_150);
                    lVar8 = *(long *)(p_Var20 + 1);
                    lVar9 = *(long *)(lVar8 + 8);
                    local_210._M_impl._0_8_ = CONCAT44(local_1e0._12_4_,local_1e0.id);
                    local_218 = (undefined1  [8])local_1e0.super_Displayable._vptr_Displayable;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_)->
                        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_210._M_impl._0_8_)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_)->
                        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_210._M_impl._0_8_)->_M_use_count + 1;
                      }
                    }
                    local_210._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
                    std::
                    vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                    ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                      *)(lVar8 + 8),
                                     (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                      *)(lVar9 + 0x18),(value_type *)local_218);
                    (*std::__detail::__variant::
                      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                      ::_S_vtable._M_arr
                      [(byte)(undefined1)local_210._M_impl.super__Rb_tree_header._M_header._M_color]
                      ._M_data)((anon_class_1_0_00000001 *)local_228,
                                (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                 *)local_218);
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)local_218,
                               (_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)&p_Var14[1]._M_parent);
                    std::
                    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                    ::_M_insert_unique<mir::inst::VarId_const&>
                              ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                                *)local_218,(VarId *)local_230);
                    this = &std::
                            map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                            ::operator[]((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                          *)&local_120,
                                         (key_type *)(&(p_Var17[1]._M_parent)->_M_color + uVar18))->
                            _M_t;
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::operator=(this,(_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                      *)local_218);
                    p_Var21 = &(p_Var17[1]._M_parent)->_M_color + uVar18;
                    if ((pointer)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        (pointer)(local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1))
                    {
                      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                ((deque<int,std::allocator<int>> *)&local_298,(int *)p_Var21);
                    }
                    else {
                      *(_Rb_tree_color *)
                       &((Displayable *)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                        _vptr_Displayable = *p_Var21;
                      local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           (_Elt_pointer)
                           ((long)&((Displayable *)
                                   local_298._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                                   _vptr_Displayable + 4);
                    }
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 *)local_218);
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              CONCAT44(local_1e0._12_4_,local_1e0.id);
                  }
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                  }
                }
LAB_00194fe8:
                uVar18 = uVar18 + 1;
                p_Var13 = p_Var17[1]._M_parent;
                p_Var16 = local_240;
                pmVar22 = local_238;
              } while (uVar18 < (ulong)((long)p_Var17[1]._M_left - (long)p_Var13 >> 2));
            }
          }
        } while (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_298._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_298);
      local_2b0 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_2b0);
    } while (local_2b0 != local_1a8);
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_188,vars);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_1a0,&notRename);
  vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_298,
                     &local_188,&local_1a0);
  pVVar12 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pVVar10 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_298._M_impl.super__Deque_impl_data._M_map;
  (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_298._M_impl.super__Deque_impl_data._M_map_size;
  (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_298._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_298._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_298._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pVVar12 != (pointer)0x0) &&
     (operator_delete(pVVar12,(long)pVVar10 - (long)pVVar12),
     local_298._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_298._M_impl.super__Deque_impl_data._M_map,
                    (long)local_298._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_298._M_impl.super__Deque_impl_data._M_map);
  }
  if (local_1a0.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_c0,local_1b0);
  build_dom_tree((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_298,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &local_c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c0);
  pVVar12 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar12) {
    p_Var2 = &local_f0._M_impl.super__Rb_tree_header;
    uVar18 = 0;
    do {
      if (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start) {
        V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_160 = &PTR_display_001eb100;
      local_158 = pVVar12[uVar18].id;
      rename((char *)&local_130,(char *)&local_160);
      push(&local_130);
      local_170.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_170.id = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)
                     ._M_impl.super__Vector_impl_data._M_start[uVar18].id;
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::_Rb_tree(&local_f0,&nodes->_M_t);
      p_Var16 = &p_Var2->_M_header;
      p_Var13 = local_f0._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var17 = &p_Var2->_M_header;
      if (local_f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var14 = p_Var13;
          p_Var15 = p_Var16;
          _Var4 = p_Var14[1]._M_color;
          p_Var16 = p_Var14;
          if ((int)_Var4 < -1) {
            p_Var16 = p_Var15;
          }
          p_Var13 = (&p_Var14->_M_left)[(int)_Var4 < -1];
        } while ((&p_Var14->_M_left)[(int)_Var4 < -1] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 != p_Var2) {
          if ((int)_Var4 < -1) {
            p_Var14 = p_Var15;
          }
          p_Var17 = p_Var16;
          if (-1 < (int)p_Var14[1]._M_color) {
            p_Var17 = &p_Var2->_M_header;
          }
        }
      }
      b = (BasicBlock *)p_Var17[1]._M_parent;
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::_Rb_tree(&local_60,&nodes->_M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_298);
      rename_var(&local_170,b,
                 (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *)&local_60,
                 (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_f0);
      uVar18 = uVar18 + 1;
      pVVar12 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(vars->
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar12 >> 4
                             ));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_298);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_120);
  return;
}

Assistant:

void generate_SSA(map<int, BasicBlock*> nodes,
                  map<mir::inst::VarId, set<int>> global,
                  map<int, vector<int>> dom_f, vector<mir::inst::VarId> vars,
                  map<int, int> dom) {
  map<mir::inst::VarId, set<int>>::iterator it;
  map<int, set<mir::inst::VarId>> phi;
  for (it = global.begin(); it != global.end(); it++) {
    queue<int> q;
    set<int>::iterator s;
    for (s = it->second.begin(); s != it->second.end(); s++) {
      q.push(*s);
    }
    while (!q.empty()) {
      int b = q.front();
      q.pop();
      map<int, vector<int>>::iterator itt = dom_f.find(b);
      if (itt != dom_f.end()) {
        for (int i = 0; i < itt->second.size(); i++) {
          map<int, set<mir::inst::VarId>>::iterator iter =
              phi.find(itt->second[i]);
          if (itt->second[i] >= 0) {
            if (iter == phi.end()) {
              map<int, BasicBlock*>::iterator itera =
                  nodes.find(itt->second[i]);
              shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
              //(*irphi).display(cout);
              itera->second->inst.insert(itera->second->inst.begin() + 1,
                                         irphi);
              set<mir::inst::VarId> varset;
              varset.insert(it->first);
              phi.insert(map<int, set<mir::inst::VarId>>::value_type(
                  itt->second[i], varset));
              q.push(itt->second[i]);
            } else {
              set<mir::inst::VarId>::iterator ss;
              ss = iter->second.find(it->first);
              if (ss == iter->second.end()) {
                map<int, BasicBlock*>::iterator itera =
                    nodes.find(itt->second[i]);
                shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
                //(*irphi).display(cout);
                itera->second->inst.insert(itera->second->inst.begin() + 1,
                                           irphi);
                set<mir::inst::VarId> varset = iter->second;
                varset.insert(it->first);
                phi[itt->second[i]] = varset;
                q.push(itt->second[i]);
              }
            }
          }
        }
      }
    }
  }

  // step3: number the vars, don't rename the $0(return value)
  vars = vectors_difference(vars, notRename);
  map<int, vector<int>> dom_tree = build_dom_tree(dom);
  for (int i = 0; i < vars.size(); i++) {
    V.clear();
    push(rename(vars[i]));
    rename_var(vars[i], find_entry(nodes), nodes, dom_tree);
  }
}